

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O1

LatticePathWithScore * __thiscall
sentencepiece::unigram::Lattice::Viterbi(LatticePathWithScore *__return_storage_ptr__,Lattice *this)

{
  pointer pvVar1;
  pointer ppNVar2;
  Node *pNVar3;
  pointer ppNVar4;
  Node **ppNVar5;
  LatticePathWithScore *pLVar6;
  Node *pNVar7;
  uint uVar8;
  int iVar9;
  ostream *poVar10;
  Node **ppNVar11;
  pointer ppNVar12;
  ulong uVar13;
  Node **ppNVar14;
  Node *pNVar15;
  pointer ppNVar16;
  float fVar17;
  float fVar18;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  results;
  LatticePathWithScore *retval;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  local_78;
  ulong local_58;
  LatticePathWithScore *local_50;
  Node *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar8 = (int)((ulong)((long)(this->surface_).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->surface_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3) - 1;
  uVar13 = 0;
  local_40 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    local_40 = uVar13;
  }
  local_38 = (ulong)((int)local_40 + 1);
  local_50 = __return_storage_ptr__;
  do {
    pvVar1 = (this->begin_nodes_).
             super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppNVar2 = *(pointer *)
               ((long)&pvVar1[uVar13].
                       super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                       ._M_impl.super__Vector_impl_data + 8);
    local_58 = uVar13;
    for (ppNVar16 = pvVar1[uVar13].
                    super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppNVar16 != ppNVar2;
        ppNVar16 = ppNVar16 + 1) {
      pNVar3 = *ppNVar16;
      pNVar3->prev = (Node *)0x0;
      pvVar1 = (this->end_nodes_).
               super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppNVar12 = pvVar1[uVar13].
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppNVar4 = *(pointer *)
                 ((long)&pvVar1[uVar13].
                         super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                         ._M_impl.super__Vector_impl_data + 8);
      if (ppNVar12 == ppNVar4) {
        fVar17 = 0.0;
        pNVar15 = (Node *)0x0;
      }
      else {
        pNVar15 = (Node *)0x0;
        fVar18 = 0.0;
        do {
          fVar17 = (*ppNVar12)->backtrace_score + pNVar3->score;
          pNVar7 = *ppNVar12;
          if (fVar17 <= fVar18 && pNVar15 != (Node *)0x0) {
            fVar17 = fVar18;
            pNVar7 = pNVar15;
          }
          pNVar15 = pNVar7;
          ppNVar12 = ppNVar12 + 1;
          fVar18 = fVar17;
        } while (ppNVar12 != ppNVar4);
      }
      if (pNVar15 == (Node *)0x0) {
        iVar9 = logging::GetMinLogLevel();
        if (iVar9 < 3) {
          local_78.
          super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)local_78.
                                super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"unigram_model.cc",0x10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0xb1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"LOG(",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"ERROR",5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"Failed to find the best path in Viterbi.",0x28);
          error::Die::~Die((Die *)&local_78);
        }
        *(undefined8 *)
         ((long)&(local_50->first).
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
        *(undefined8 *)
         ((long)&(local_50->first).
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
        (local_50->first).
        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_50->first).
        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      else {
        pNVar3->prev = pNVar15;
        pNVar3->backtrace_score = fVar17;
      }
      if (pNVar15 == (Node *)0x0) {
        return local_50;
      }
    }
    uVar13 = local_58 + 1;
    if (uVar13 == local_38) {
      local_78.
      super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (Node **)0x0;
      local_78.
      super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (Node **)0x0;
      local_78.
      super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (Node **)0x0;
      pvVar1 = (this->begin_nodes_).
               super__Vector_base<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_58 = CONCAT44(local_58._4_4_,
                          *(undefined4 *)
                           (**(long **)&pvVar1[local_40 & 0xffffffff].
                                        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                        ._M_impl.super__Vector_impl_data + 0x24));
      local_48 = *(Node **)(**(long **)&pvVar1[local_40 & 0xffffffff].
                                        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                                        ._M_impl.super__Vector_impl_data + 0x28);
      if (local_48->prev != (Node *)0x0) {
        do {
          if (local_78.
              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_78.
              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>
            ::_M_realloc_insert<sentencepiece::unigram::Lattice::Node*const&>
                      ((vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>
                        *)&local_78,
                       (iterator)
                       local_78.
                       super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_48);
          }
          else {
            *local_78.
             super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_48;
            local_78.
            super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_78.
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_48 = local_48->prev;
        } while (local_48->prev != (Node *)0x0);
      }
      pLVar6 = local_50;
      ppNVar14 = local_78.
                 super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
      ppNVar5 = local_78.
                super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_78.
          super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_start < ppNVar14 &&
          local_78.
          super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_78.
          super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          ppNVar11 = ppNVar5 + 1;
          pNVar3 = *ppNVar5;
          *ppNVar5 = *ppNVar14;
          *ppNVar14 = pNVar3;
          ppNVar14 = ppNVar14 + -1;
          ppNVar5 = ppNVar11;
        } while (ppNVar11 < ppNVar14);
      }
      std::
      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::vector(&local_50->first,&local_78);
      pLVar6->second = (float)local_58;
      if (local_78.
          super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (Node **)0x0) {
        operator_delete(local_78.
                        super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return local_50;
    }
  } while( true );
}

Assistant:

Lattice::LatticePathWithScore Lattice::Viterbi() {
  const int len = size();

  for (int pos = 0; pos <= len; ++pos) {
    for (Node *rnode : begin_nodes_[pos]) {
      rnode->prev = nullptr;
      float best_score = 0.0;
      Node *best_node = nullptr;
      for (Node *lnode : end_nodes_[pos]) {
        const float score = lnode->backtrace_score + rnode->score;
        if (best_node == nullptr || score > best_score) {
          best_node = lnode;
          best_score = score;
        }
      }
      if (best_node == nullptr) {
        LOG(ERROR) << "Failed to find the best path in Viterbi.";
        return {};
      }
      rnode->prev = best_node;
      rnode->backtrace_score = best_score;
    }
  }

  // backtrace
  std::vector<Node *> results;
  float score = begin_nodes(len)[0]->backtrace_score;
  for (Node *node = begin_nodes_[len][0]->prev; node->prev != nullptr;
       node = node->prev) {
    results.push_back(node);
  }

  std::reverse(results.begin(), results.end());

  LatticePathWithScore retval = {results, score};

  return retval;
}